

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

MESSAGE_BODY_TYPE internal_get_body_type(MESSAGE_HANDLE message)

{
  MESSAGE_BODY_TYPE local_14;
  MESSAGE_BODY_TYPE result;
  MESSAGE_HANDLE message_local;
  
  if (message->body_amqp_value == (AMQP_VALUE)0x0) {
    if (message->body_amqp_data_count == 0) {
      if (message->body_amqp_sequence_count == 0) {
        local_14 = MESSAGE_BODY_TYPE_NONE;
      }
      else {
        local_14 = MESSAGE_BODY_TYPE_SEQUENCE;
      }
    }
    else {
      local_14 = MESSAGE_BODY_TYPE_DATA;
    }
  }
  else {
    local_14 = MESSAGE_BODY_TYPE_VALUE;
  }
  return local_14;
}

Assistant:

MESSAGE_BODY_TYPE internal_get_body_type(MESSAGE_HANDLE message)
{
    MESSAGE_BODY_TYPE result;

    if (message->body_amqp_value != NULL)
    {
        result = MESSAGE_BODY_TYPE_VALUE;
    }
    else if (message->body_amqp_data_count > 0)
    {
        result = MESSAGE_BODY_TYPE_DATA;
    }
    else if (message->body_amqp_sequence_count > 0)
    {
        result = MESSAGE_BODY_TYPE_SEQUENCE;
    }
    else
    {
        result = MESSAGE_BODY_TYPE_NONE;
    }

    return result;
}